

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

u32 crc32_slice8(u32 crc,u8 *p,size_t len)

{
  uint uVar1;
  uint uVar2;
  u8 *puVar3;
  u8 *puVar4;
  u32 v2;
  u32 v1;
  u8 *end64;
  u8 *end;
  size_t len_local;
  u8 *p_local;
  u32 crc_local;
  
  puVar3 = p + len;
  crc_local = crc;
  for (p_local = p; ((ulong)p_local & 7) != 0 && p_local != puVar3; p_local = p_local + 1) {
    crc_local = crc_local >> 8 ^ crc32_slice8_table[(int)(crc_local & 0xff ^ (uint)*p_local)];
  }
  puVar4 = p_local + ((long)puVar3 - (long)p_local & 0xfffffffffffffff8);
  for (; p_local != puVar4; p_local = p_local + 8) {
    uVar1 = *(uint *)p_local;
    uVar2 = *(uint *)(p_local + 4);
    crc_local = crc32_slice8_table[(int)(((crc_local ^ uVar1) & 0xff) + 0x700)] ^
                crc32_slice8_table[(int)(((crc_local ^ uVar1) >> 8 & 0xff) + 0x600)] ^
                crc32_slice8_table[(int)(((crc_local ^ uVar1) >> 0x10 & 0xff) + 0x500)] ^
                crc32_slice8_table[(int)(((crc_local ^ uVar1) >> 0x18) + 0x400)] ^
                crc32_slice8_table[(int)((uVar2 & 0xff) + 0x300)] ^
                crc32_slice8_table[(int)((uVar2 >> 8 & 0xff) + 0x200)] ^
                crc32_slice8_table[(int)((uVar2 >> 0x10 & 0xff) + 0x100)] ^
                crc32_slice8_table[(int)(uVar2 >> 0x18)];
  }
  for (; p_local != puVar3; p_local = p_local + 1) {
    crc_local = crc_local >> 8 ^ crc32_slice8_table[(int)(crc_local & 0xff ^ (uint)*p_local)];
  }
  return crc_local;
}

Assistant:

static u32 MAYBE_UNUSED
crc32_slice8(u32 crc, const u8 *p, size_t len)
{
	const u8 * const end = p + len;
	const u8 *end64;

	for (; ((uintptr_t)p & 7) && p != end; p++)
		crc = (crc >> 8) ^ crc32_slice8_table[(u8)crc ^ *p];

	end64 = p + ((end - p) & ~7);
	for (; p != end64; p += 8) {
		u32 v1 = le32_bswap(*(const u32 *)(p + 0));
		u32 v2 = le32_bswap(*(const u32 *)(p + 4));

		crc = crc32_slice8_table[0x700 + (u8)((crc ^ v1) >> 0)] ^
		      crc32_slice8_table[0x600 + (u8)((crc ^ v1) >> 8)] ^
		      crc32_slice8_table[0x500 + (u8)((crc ^ v1) >> 16)] ^
		      crc32_slice8_table[0x400 + (u8)((crc ^ v1) >> 24)] ^
		      crc32_slice8_table[0x300 + (u8)(v2 >> 0)] ^
		      crc32_slice8_table[0x200 + (u8)(v2 >> 8)] ^
		      crc32_slice8_table[0x100 + (u8)(v2 >> 16)] ^
		      crc32_slice8_table[0x000 + (u8)(v2 >> 24)];
	}

	for (; p != end; p++)
		crc = (crc >> 8) ^ crc32_slice8_table[(u8)crc ^ *p];

	return crc;
}